

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retCore.c
# Opt level: O0

int Abc_NtkRetime(Abc_Ntk_t *pNtk,int Mode,int nDelayLim,int fForwardOnly,int fBackwardOnly,
                 int fOneStep,int fUseOldNames,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  abctime aVar8;
  int nLatchesOld;
  int nNodesOld;
  abctime clkTotal;
  int RetValue;
  int nLevels;
  int nLatches;
  int fOneStep_local;
  int fBackwardOnly_local;
  int fForwardOnly_local;
  int nDelayLim_local;
  int Mode_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  iVar2 = Abc_NtkLevel(pNtk);
  clkTotal._0_4_ = 0;
  aVar7 = Abc_Clock();
  if ((Mode < 1) || (6 < Mode)) {
    __assert_fail("Mode > 0 && Mode < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retCore.c"
                  ,0x36,"int Abc_NtkRetime(Abc_Ntk_t *, int, int, int, int, int, int, int)");
  }
  if ((fForwardOnly != 0) && (fBackwardOnly != 0)) {
    __assert_fail("!fForwardOnly || !fBackwardOnly",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retCore.c"
                  ,0x37,"int Abc_NtkRetime(Abc_Ntk_t *, int, int, int, int, int, int, int)");
  }
  iVar3 = Abc_NtkNodeNum(pNtk);
  iVar4 = Abc_NtkLatchNum(pNtk);
  Abc_NtkCleanupSeq(pNtk,0,0,0);
  iVar5 = Abc_NtkNodeNum(pNtk);
  if ((iVar5 < iVar3) || (iVar5 = Abc_NtkLatchNum(pNtk), iVar5 < iVar4)) {
    iVar5 = Abc_NtkNodeNum(pNtk);
    iVar6 = Abc_NtkLatchNum(pNtk);
    printf("Cleanup before retiming removed %d dangling nodes and %d dangling latches.\n",
           (ulong)(uint)(iVar3 - iVar5),(ulong)(uint)(iVar4 - iVar6));
  }
  switch(Mode) {
  case 1:
    clkTotal._0_4_ = Abc_NtkRetimeIncremental(pNtk,nDelayLim,1,0,0,fUseOldNames,fVerbose);
    break;
  case 2:
    clkTotal._0_4_ = Abc_NtkRetimeIncremental(pNtk,nDelayLim,0,0,0,fUseOldNames,fVerbose);
    break;
  case 3:
    clkTotal._0_4_ = Abc_NtkRetimeMinArea(pNtk,fForwardOnly,fBackwardOnly,fUseOldNames,fVerbose);
    break;
  case 4:
    if (fBackwardOnly == 0) {
      clkTotal._0_4_ = Abc_NtkRetimeIncremental(pNtk,nDelayLim,1,1,fOneStep,fUseOldNames,fVerbose);
    }
    if (fForwardOnly == 0) {
      iVar3 = Abc_NtkRetimeIncremental(pNtk,nDelayLim,0,1,fOneStep,fUseOldNames,fVerbose);
      clkTotal._0_4_ = iVar3 + (int)clkTotal;
    }
    break;
  case 5:
    clkTotal._0_4_ = Abc_NtkRetimeMinArea(pNtk,fForwardOnly,fBackwardOnly,fUseOldNames,fVerbose);
    if (fBackwardOnly == 0) {
      iVar3 = Abc_NtkRetimeIncremental(pNtk,nDelayLim,1,1,0,fUseOldNames,fVerbose);
      clkTotal._0_4_ = iVar3 + (int)clkTotal;
    }
    if (fForwardOnly == 0) {
      iVar3 = Abc_NtkRetimeIncremental(pNtk,nDelayLim,0,1,0,fUseOldNames,fVerbose);
      clkTotal._0_4_ = iVar3 + (int)clkTotal;
    }
    break;
  case 6:
    clkTotal._0_4_ = Abc_NtkRetimeLValue(pNtk,500,fVerbose);
    break;
  default:
    printf("Unknown retiming option.\n");
  }
  if (fVerbose != 0) {
    iVar3 = Abc_NtkLatchNum(pNtk);
    iVar4 = Abc_NtkLevel(pNtk);
    printf("Reduction in area = %3d. Reduction in delay = %3d. ",(ulong)(uint)(iVar1 - iVar3),
           (ulong)(uint)(iVar2 - iVar4));
    Abc_Print(1,"%s =","Total runtime");
    aVar8 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
  }
  aVar8 = Abc_Clock();
  timeRetime = aVar8 - aVar7;
  return (int)clkTotal;
}

Assistant:

int Abc_NtkRetime( Abc_Ntk_t * pNtk, int Mode, int nDelayLim, int fForwardOnly, int fBackwardOnly, int fOneStep, int fUseOldNames, int fVerbose )
{
    int nLatches = Abc_NtkLatchNum(pNtk);
    int nLevels  = Abc_NtkLevel(pNtk);
    int RetValue = 0;
    abctime clkTotal = Abc_Clock();
    int nNodesOld, nLatchesOld;
    assert( Mode > 0 && Mode < 7 );
    assert( !fForwardOnly || !fBackwardOnly );

    // cleanup the network
    nNodesOld   = Abc_NtkNodeNum(pNtk);
    nLatchesOld = Abc_NtkLatchNum(pNtk);
    Abc_NtkCleanupSeq(pNtk, 0, 0, 0);
    if ( nNodesOld > Abc_NtkNodeNum(pNtk) || nLatchesOld > Abc_NtkLatchNum(pNtk) )
        printf( "Cleanup before retiming removed %d dangling nodes and %d dangling latches.\n",
            nNodesOld - Abc_NtkNodeNum(pNtk), nLatchesOld - Abc_NtkLatchNum(pNtk) );

    // perform retiming
    switch ( Mode )
    {
    case 1: // forward 
        RetValue = Abc_NtkRetimeIncremental( pNtk, nDelayLim, 1, 0, 0, fUseOldNames, fVerbose );
        break;
    case 2: // backward 
        RetValue = Abc_NtkRetimeIncremental( pNtk, nDelayLim, 0, 0, 0, fUseOldNames, fVerbose );
        break;
    case 3: // min-area 
        RetValue = Abc_NtkRetimeMinArea( pNtk, fForwardOnly, fBackwardOnly, fUseOldNames, fVerbose );
        break;
    case 4: // min-delay
        if ( !fBackwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 1, 1, fOneStep, fUseOldNames, fVerbose );
        if ( !fForwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 0, 1, fOneStep, fUseOldNames, fVerbose );
        break;
    case 5: // min-area + min-delay
        RetValue  = Abc_NtkRetimeMinArea( pNtk, fForwardOnly, fBackwardOnly, fUseOldNames, fVerbose );
        if ( !fBackwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 1, 1, 0, fUseOldNames, fVerbose );
        if ( !fForwardOnly )
            RetValue += Abc_NtkRetimeIncremental( pNtk, nDelayLim, 0, 1, 0, fUseOldNames, fVerbose );
        break;
    case 6: // Pan's algorithm
        RetValue = Abc_NtkRetimeLValue( pNtk, 500, fVerbose );
        break;
    default:
        printf( "Unknown retiming option.\n" );
        break;
    }
    if ( fVerbose )
    {
        printf( "Reduction in area = %3d. Reduction in delay = %3d. ", 
            nLatches - Abc_NtkLatchNum(pNtk), nLevels - Abc_NtkLevel(pNtk) );
        ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    }
    timeRetime = Abc_Clock() - clkTotal;
    return RetValue;
}